

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

size_t doctest::detail::my_strlen(char *in)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *temp;
  
  if (in == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = in + -1;
    pcVar3 = in;
    do {
      pcVar2 = pcVar2 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return (long)pcVar2 - (long)in;
}

Assistant:

size_t my_strlen(const char* in) {
        const char* temp = in;
        while(temp && *temp)
            ++temp;
        return temp - in;
    }